

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeExponent(ParsedPatternInfo *this,UErrorCode *status)

{
  ParsedSubpatternInfo *pPVar1;
  UChar32 UVar2;
  ParserState *this_00;
  
  pPVar1 = this->currentSubpattern;
  this_00 = &this->state;
  UVar2 = ParserState::peek(this_00);
  if (UVar2 == 0x45) {
    if ((~(uint)pPVar1->groupingSizes & 0xffff0000) == 0) {
      ParserState::next(this_00);
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      UVar2 = ParserState::peek(this_00);
      if (UVar2 != 0x2b) goto LAB_0025dcd2;
      ParserState::next(this_00);
      pPVar1->exponentHasPlusSign = true;
      while( true ) {
        pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
LAB_0025dcd2:
        UVar2 = ParserState::peek(this_00);
        if (UVar2 != 0x30) break;
        ParserState::next(this_00);
        pPVar1->exponentZeros = pPVar1->exponentZeros + 1;
      }
    }
    else {
      *status = U_MALFORMED_EXPONENTIAL_PATTERN;
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeExponent(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    if (state.peek() != u'E') {
        return;
    }
    if ((result.groupingSizes & 0xffff0000L) != 0xffff0000L) {
        state.toParseException(u"Cannot have grouping separator in scientific notation");
        status = U_MALFORMED_EXPONENTIAL_PATTERN;
        return;
    }
    state.next(); // consume the E
    result.widthExceptAffixes++;
    if (state.peek() == u'+') {
        state.next(); // consume the +
        result.exponentHasPlusSign = true;
        result.widthExceptAffixes++;
    }
    while (state.peek() == u'0') {
        state.next(); // consume the 0
        result.exponentZeros += 1;
        result.widthExceptAffixes++;
    }
}